

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_unittests.cc
# Opt level: O2

void (anonymous_namespace)::test_color<color<unsigned_char,1u>>
               (color<unsigned_char,_1U> input,color<unsigned_char,_1U> output)

{
  char *pcVar1;
  color<unsigned_char,_1U> color;
  anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3 local_30;
  undefined7 uStack_2f;
  AssertHelper local_28;
  AssertionResult gtest_ar;
  
  color = input;
  local_30 = input.field_0;
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)&gtest_ar,"color[i]",
             "static_cast<typename ColorType::value_type>(input[i])",(uchar *)&color,local_30.comps)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30.field_1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/image_unittests.cc"
               ,0x2c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30.field_1);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT71(uStack_2f,local_30) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_2f,local_30) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  if (color.field_0 != (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)0x0) {
    color.field_0 =
         (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)
         (anon_struct_1_1_54a39812_for_anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3_1)0xff
    ;
  }
  local_30 = output.field_0;
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)&gtest_ar,"color[i]",
             "static_cast<typename ColorType::value_type>(output[i])",(uchar *)&color,local_30.comps
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30.field_1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/image_unittests.cc"
               ,0x32,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30.field_1);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT71(uStack_2f,local_30) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_2f,local_30) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void test_color(ColorType input, ColorType output) {
    ColorType color;
    for (uint32_t i = 0; i < color.comps_count(); ++i) {
        color.set(i, static_cast<typename ColorType::value_type>(input[i]));
    }

    // Verify color components were set correctly
    for (uint32_t i = 0; i < color.comps_count(); ++i) {
        EXPECT_EQ(color[i], static_cast<typename ColorType::value_type>(input[i]));
    }

    color.normalize();

    for (uint32_t  i = 0; i < color.comps_count(); ++i) {
        EXPECT_EQ(color[i], static_cast<typename ColorType::value_type>(output[i]));
    }
}